

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O2

void Omega_h::vtk::read_vtu_ents(istream *stream,Mesh *mesh)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  __type _Var5;
  byte bVar6;
  int size_in;
  int size;
  int iVar7;
  Omega_h_Family family_in;
  mapped_type *pmVar8;
  size_type sVar9;
  uint uVar10;
  undefined8 uVar11;
  int x;
  char *pcVar12;
  Tag tag6;
  Write<long> local_418;
  Read<double> coords;
  Tag tag5;
  Tag tag7;
  Write<long> local_348;
  Tag tag8;
  Write<int> local_2d8;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_2c0;
  Write<int> local_2b0;
  Write<int> local_2a0;
  Write<int> local_290;
  Write<double> local_280;
  Write<int> local_270;
  Write<double> local_260;
  CommPtr comm;
  Tag tag9;
  Tag tag3;
  Tag tag4;
  Tag tag10;
  Tag tag2;
  Tag tag1;
  
  xml_lite::read_tag(&tag5,stream);
  bVar2 = std::operator==(&tag5.elem_name,"VTKFile");
  if (!bVar2) {
    fail("assertion %s failed at %s +%d\n","st.elem_name == \"VTKFile\"",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x175);
  }
  std::__cxx11::string::string((string *)&tag6,"header_type",(allocator *)&tag1);
  pmVar1 = &tag5.attribs;
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&tag6.elem_name);
  bVar2 = std::operator==(pmVar8,"UInt64");
  if (!bVar2) {
    fail("assertion %s failed at %s +%d\n",
         "st.attribs[\"header_type\"] == Traits<std::uint64_t>::name()",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x176);
  }
  std::__cxx11::string::~string((string *)&tag6);
  std::__cxx11::string::string((string *)&tag6,"byte_order",(allocator *)&tag1);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar1,&tag6.elem_name);
  bVar2 = std::operator==(pmVar8,"LittleEndian");
  std::__cxx11::string::~string((string *)&tag6);
  bVar3 = is_little_endian_cpu();
  std::__cxx11::string::string((string *)&tag6,"compressor",(allocator *)&tag1);
  sVar9 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(pmVar1,&tag6.elem_name);
  std::__cxx11::string::~string((string *)&tag6);
  xml_lite::Tag::~Tag(&tag5);
  xml_lite::read_tag(&tag1,stream);
  bVar4 = std::operator==(&tag1.elem_name,"UnstructuredGrid");
  if (!bVar4) {
    fail("assertion %s failed at %s +%d\n","tag1.elem_name == \"UnstructuredGrid\"",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x299);
  }
  xml_lite::read_tag(&tag5,stream);
  bVar4 = std::operator==(&tag5.elem_name,"Piece");
  if (!bVar4) {
    fail("assertion %s failed at %s +%d\n","st.elem_name == \"Piece\"",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x186);
  }
  std::__cxx11::string::string((string *)&tag6,"NumberOfPoints",(allocator *)&tag2);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&tag5.attribs,&tag6.elem_name);
  size_in = std::__cxx11::stoi(pmVar8,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&tag6);
  std::__cxx11::string::string((string *)&tag6,"NumberOfCells",(allocator *)&tag2);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&tag5.attribs,&tag6.elem_name);
  size = std::__cxx11::stoi(pmVar8,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&tag6);
  xml_lite::Tag::~Tag(&tag5);
  xml_lite::read_tag(&tag2,stream);
  bVar4 = std::operator==(&tag2.elem_name,"Cells");
  if (!bVar4) {
    fail("assertion %s failed at %s +%d\n","tag2.elem_name == \"Cells\"",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
         ,0x29d);
  }
  Omega_h::Mesh::comm((Mesh *)&comm);
  local_2d8.shared_alloc_.alloc = (Alloc *)0x0;
  local_2d8.shared_alloc_.direct_ptr = (void *)0x0;
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_2c0,&comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)&tag4,"types",(allocator *)&tag9);
  xml_lite::read_tag(&tag5,stream);
  bVar4 = std::operator==(&tag5.elem_name,"DataArray");
  if (bVar4) {
    if (tag5.type == START) {
      std::__cxx11::string::string((string *)&tag6,"Name",(allocator *)&tag3);
      pmVar1 = &tag5.attribs;
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&tag6.elem_name);
      _Var5 = std::operator==(pmVar8,&tag4.elem_name);
      if (!_Var5) {
        fail("assertion %s failed at %s +%d\n","st.attribs[\"Name\"] == name",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
             ,0x148);
      }
      std::__cxx11::string::~string((string *)&tag6);
      std::__cxx11::string::string((string *)&tag6,"type",(allocator *)&tag3);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&tag6.elem_name);
      bVar4 = std::operator==(pmVar8,"Int8");
      if (!bVar4) {
        fail("assertion %s failed at %s +%d\n","st.attribs[\"type\"] == Traits<T>::name()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
             ,0x149);
      }
      std::__cxx11::string::~string((string *)&tag6);
      std::__cxx11::string::string((string *)&tag6,"NumberOfComponents",(allocator *)&tag8);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](pmVar1,&tag6.elem_name);
      std::__cxx11::to_string(&tag3.elem_name,1);
      _Var5 = std::operator==(pmVar8,&tag3.elem_name);
      if (!_Var5) {
        fail("assertion %s failed at %s +%d\n",
             "st.attribs[\"NumberOfComponents\"] == std::to_string(ncomps)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
             ,0x14a);
      }
      bVar3 = bVar2 != bVar3;
      std::__cxx11::string::~string((string *)&tag3);
      std::__cxx11::string::~string((string *)&tag6);
      read_array<signed_char>((vtk *)&tag7,stream,size,bVar3,sVar9 == 1);
      xml_lite::read_tag(&tag6,stream);
      bVar2 = std::operator==(&tag6.elem_name,"DataArray");
      if (bVar2) {
        if (tag6.type == END) {
          xml_lite::Tag::~Tag(&tag6);
          xml_lite::Tag::~Tag(&tag5);
          std::__cxx11::string::~string((string *)&tag4);
          if (((ulong)tag7.elem_name._M_dataplus._M_p & 1) == 0) {
            iVar7 = *(int *)tag7.elem_name._M_dataplus._M_p;
          }
          else {
            iVar7 = (int)((ulong)tag7.elem_name._M_dataplus._M_p >> 3);
          }
          if (iVar7 == 0) {
            x = -1;
            iVar7 = 0;
          }
          else {
            bVar6 = Read<signed_char>::get((Read<signed_char> *)&tag7,0);
            uVar10 = bVar6 - 3;
            if ((9 < (byte)uVar10) || ((0x2c5U >> (uVar10 & 0x1f) & 1) == 0)) {
              fail("Unexpected VTK type %d\n",(ulong)(uint)(int)(char)bVar6);
            }
            uVar10 = (uVar10 & 0xff) << 2;
            iVar7 = *(int *)(&DAT_00384b6c + uVar10);
            x = *(int *)(&DAT_00384b94 + uVar10);
          }
          family_in = Comm::allreduce<int>(local_2c0._M_ptr,iVar7,OMEGA_H_MAX);
          uVar10 = Comm::allreduce<int>(local_2c0._M_ptr,x,OMEGA_H_MAX);
          if (family_in == OMEGA_H_SIMPLEX) {
            iVar7 = -1;
            if (uVar10 < 4) {
              iVar7 = uVar10 + 1;
            }
          }
          else if (uVar10 < 4) {
            iVar7 = *(int *)(&DAT_00377770 + (ulong)uVar10 * 4);
          }
          else {
            iVar7 = -1;
          }
          std::__cxx11::string::string((string *)&tag5,"connectivity",(allocator *)&tag3);
          read_known_array<int>
                    ((istream *)&tag6,(string *)stream,(LO)&tag5,iVar7 * size,bVar3,sVar9 == 1);
          std::__cxx11::string::~string((string *)&tag5);
          Write<int>::operator=(&local_2d8,(Write<int> *)&tag6);
          std::__cxx11::string::string((string *)&tag5,"offsets",(allocator *)&tag4);
          read_known_array<int>((istream *)&tag3,(string *)stream,(LO)&tag5,size,bVar3,sVar9 == 1);
          Write<int>::~Write((Write<int> *)&tag3);
          std::__cxx11::string::~string((string *)&tag5);
          Write<int>::~Write((Write<int> *)&tag6);
          Write<signed_char>::~Write((Write<signed_char> *)&tag7);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2c0._M_refcount);
          Omega_h::Mesh::set_family(mesh,family_in);
          Omega_h::Mesh::set_dim(mesh,uVar10);
          xml_lite::read_tag(&tag3,stream);
          bVar2 = std::operator==(&tag3.elem_name,"Cells");
          if (!bVar2) {
            fail("assertion %s failed at %s +%d\n","tag3.elem_name == \"Cells\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                 ,0x2a7);
          }
          xml_lite::read_tag(&tag4,stream);
          bVar2 = std::operator==(&tag4.elem_name,"Points");
          if (!bVar2) {
            fail("assertion %s failed at %s +%d\n","tag4.elem_name == \"Points\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                 ,0x2a9);
          }
          std::__cxx11::string::string((string *)&tag8,"coordinates",(allocator *)&tag10);
          xml_lite::read_tag(&tag5,stream);
          bVar2 = std::operator==(&tag5.elem_name,"DataArray");
          if (bVar2) {
            if (tag5.type == START) {
              std::__cxx11::string::string((string *)&tag6,"Name",(allocator *)&tag7);
              pmVar1 = &tag5.attribs;
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](pmVar1,&tag6.elem_name);
              _Var5 = std::operator==(pmVar8,&tag8.elem_name);
              if (!_Var5) {
                fail("assertion %s failed at %s +%d\n","st.attribs[\"Name\"] == name",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                     ,0x148);
              }
              std::__cxx11::string::~string((string *)&tag6);
              std::__cxx11::string::string((string *)&tag6,"type",(allocator *)&tag7);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](pmVar1,&tag6.elem_name);
              bVar2 = std::operator==(pmVar8,"Float64");
              if (!bVar2) {
                fail("assertion %s failed at %s +%d\n","st.attribs[\"type\"] == Traits<T>::name()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                     ,0x149);
              }
              std::__cxx11::string::~string((string *)&tag6);
              std::__cxx11::string::string((string *)&tag6,"NumberOfComponents",(allocator *)&tag9);
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](pmVar1,&tag6.elem_name);
              std::__cxx11::to_string(&tag7.elem_name,3);
              _Var5 = std::operator==(pmVar8,&tag7.elem_name);
              if (!_Var5) {
                fail("assertion %s failed at %s +%d\n",
                     "st.attribs[\"NumberOfComponents\"] == std::to_string(ncomps)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                     ,0x14a);
              }
              std::__cxx11::string::~string((string *)&tag7);
              std::__cxx11::string::~string((string *)&tag6);
              read_array<double>((vtk *)&coords,stream,size_in * 3,bVar3,sVar9 == 1);
              xml_lite::read_tag(&tag6,stream);
              bVar2 = std::operator==(&tag6.elem_name,"DataArray");
              if (bVar2) {
                if (tag6.type == END) {
                  xml_lite::Tag::~Tag(&tag6);
                  xml_lite::Tag::~Tag(&tag5);
                  std::__cxx11::string::~string((string *)&tag8);
                  if ((int)uVar10 < 3) {
                    Write<double>::Write(&local_260,&coords.write_);
                    resize_vectors((Omega_h *)&tag5,(Reals *)&local_260,3,uVar10);
                    Write<double>::operator=(&coords.write_,(Write<signed_char> *)&tag5);
                    Write<double>::~Write((Write<double> *)&tag5);
                    Write<double>::~Write(&local_260);
                  }
                  xml_lite::read_tag(&tag5,stream);
                  bVar2 = std::operator==(&tag5.elem_name,"Points");
                  if (!bVar2) {
                    fail("assertion %s failed at %s +%d\n","tag5.elem_name == \"Points\"",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                         ,0x2ae);
                  }
                  xml_lite::read_tag(&tag6,stream);
                  bVar2 = std::operator==(&tag6.elem_name,"PointData");
                  if (!bVar2) {
                    fail("assertion %s failed at %s +%d\n","tag6.elem_name == \"PointData\"",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                         ,0x2b0);
                  }
                  local_418.shared_alloc_.alloc = (Alloc *)0x0;
                  local_418.shared_alloc_.direct_ptr = (void *)0x0;
                  bVar2 = Omega_h::Mesh::could_be_shared(mesh,0);
                  if (bVar2) {
                    std::__cxx11::string::string((string *)&tag7,"global",(allocator *)&tag9);
                    read_known_array<long>
                              ((istream *)&tag8,(string *)stream,(LO)&tag7,size_in,bVar3,sVar9 == 1)
                    ;
                  }
                  else {
                    std::__cxx11::string::string((string *)&tag7,"",(allocator *)&tag9);
                    Read<long>::Read((Read<long> *)&tag8,size_in,0,1,&tag7.elem_name);
                  }
                  Write<long>::operator=(&local_418,(Write<long> *)&tag8);
                  Write<long>::~Write((Write<long> *)&tag8);
                  std::__cxx11::string::~string((string *)&tag7);
                  Write<long>::Write(&local_270,(Write<int> *)&local_418);
                  build_verts_from_globals(mesh,(GOs *)&local_270);
                  Write<long>::~Write((Write<long> *)&local_270);
                  std::__cxx11::string::string((string *)&tag7,"coordinates",(allocator *)&tag8);
                  Write<double>::Write(&local_280,&coords.write_);
                  Omega_h::Mesh::add_tag<double>
                            (mesh,0,&tag7.elem_name,uVar10,(Read<double> *)&local_280,true);
                  Write<double>::~Write(&local_280);
                  std::__cxx11::string::~string((string *)&tag7);
                  do {
                    bVar2 = read_tag(stream,mesh,0,bVar3,sVar9 == 1);
                  } while (bVar2);
                  std::__cxx11::string::string((string *)&tag7,"local",(allocator *)&tag8);
                  Omega_h::Mesh::remove_tag(mesh,0,&tag7.elem_name);
                  std::__cxx11::string::~string((string *)&tag7);
                  std::__cxx11::string::string((string *)&tag7,"owner",(allocator *)&tag8);
                  Omega_h::Mesh::remove_tag(mesh,0,&tag7.elem_name);
                  std::__cxx11::string::~string((string *)&tag7);
                  xml_lite::read_tag(&tag7,stream);
                  bVar2 = std::operator==(&tag7.elem_name,"CellData");
                  if (!bVar2) {
                    fail("assertion %s failed at %s +%d\n","tag7.elem_name == \"CellData\"",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                         ,0x2bf);
                  }
                  local_348.shared_alloc_.alloc = (Alloc *)0x0;
                  local_348.shared_alloc_.direct_ptr = (void *)0x0;
                  bVar2 = Omega_h::Mesh::could_be_shared(mesh,uVar10);
                  if (bVar2) {
                    std::__cxx11::string::string((string *)&tag8,"global",(allocator *)&tag10);
                    read_known_array<long>
                              ((istream *)&tag9,(string *)stream,(LO)&tag8,size,bVar3,sVar9 == 1);
                  }
                  else {
                    std::__cxx11::string::string((string *)&tag8,"",(allocator *)&tag10);
                    Read<long>::Read((Read<long> *)&tag9,size,0,1,&tag8.elem_name);
                  }
                  Write<long>::operator=(&local_348,(Write<long> *)&tag9);
                  Write<long>::~Write((Write<long> *)&tag9);
                  std::__cxx11::string::~string((string *)&tag8);
                  Write<int>::Write(&local_290,&local_2d8);
                  Write<long>::Write(&local_2a0,(Write<int> *)&local_418);
                  Write<long>::Write(&local_2b0,(Write<int> *)&local_348);
                  build_ents_from_elems2verts
                            (mesh,(LOs *)&local_290,(GOs *)&local_2a0,(GOs *)&local_2b0);
                  Write<long>::~Write((Write<long> *)&local_2b0);
                  Write<long>::~Write((Write<long> *)&local_2a0);
                  Write<int>::~Write(&local_290);
                  do {
                    bVar2 = read_tag(stream,mesh,uVar10,bVar3,sVar9 == 1);
                  } while (bVar2);
                  std::__cxx11::string::string((string *)&tag8,"local",(allocator *)&tag9);
                  Omega_h::Mesh::remove_tag(mesh,uVar10,&tag8.elem_name);
                  std::__cxx11::string::~string((string *)&tag8);
                  std::__cxx11::string::string((string *)&tag8,"owner",(allocator *)&tag9);
                  Omega_h::Mesh::remove_tag(mesh,uVar10,&tag8.elem_name);
                  std::__cxx11::string::~string((string *)&tag8);
                  xml_lite::read_tag(&tag8,stream);
                  bVar2 = std::operator==(&tag8.elem_name,"Piece");
                  if (!bVar2) {
                    fail("assertion %s failed at %s +%d\n","tag8.elem_name == \"Piece\"",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                         ,0x2cd);
                  }
                  xml_lite::read_tag(&tag9,stream);
                  bVar2 = std::operator==(&tag9.elem_name,"UnstructuredGrid");
                  if (!bVar2) {
                    fail("assertion %s failed at %s +%d\n","tag9.elem_name == \"UnstructuredGrid\"",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                         ,0x2cf);
                  }
                  xml_lite::read_tag(&tag10,stream);
                  bVar2 = std::operator==(&tag10.elem_name,"VTKFile");
                  if (!bVar2) {
                    fail("assertion %s failed at %s +%d\n","tag10.elem_name == \"VTKFile\"",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                         ,0x2d1);
                  }
                  xml_lite::Tag::~Tag(&tag10);
                  xml_lite::Tag::~Tag(&tag9);
                  xml_lite::Tag::~Tag(&tag8);
                  Write<long>::~Write(&local_348);
                  xml_lite::Tag::~Tag(&tag7);
                  Write<long>::~Write(&local_418);
                  xml_lite::Tag::~Tag(&tag6);
                  xml_lite::Tag::~Tag(&tag5);
                  Write<double>::~Write(&coords.write_);
                  xml_lite::Tag::~Tag(&tag4);
                  xml_lite::Tag::~Tag(&tag3);
                  Write<int>::~Write(&local_2d8);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&comm.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                  xml_lite::Tag::~Tag(&tag2);
                  xml_lite::Tag::~Tag(&tag1);
                  return;
                }
                uVar11 = 0x14f;
                pcVar12 = "et.type == xml_lite::Tag::END";
              }
              else {
                uVar11 = 0x14e;
                pcVar12 = "et.elem_name == \"DataArray\"";
              }
              fail("assertion %s failed at %s +%d\n",pcVar12,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
                   ,uVar11);
            }
            uVar11 = 0x147;
            pcVar12 = "st.type == xml_lite::Tag::START";
          }
          else {
            uVar11 = 0x146;
            pcVar12 = "st.elem_name == \"DataArray\"";
          }
          fail("assertion %s failed at %s +%d\n",pcVar12,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
               ,uVar11);
        }
        uVar11 = 0x14f;
        pcVar12 = "et.type == xml_lite::Tag::END";
      }
      else {
        uVar11 = 0x14e;
        pcVar12 = "et.elem_name == \"DataArray\"";
      }
      fail("assertion %s failed at %s +%d\n",pcVar12,
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
           ,uVar11);
    }
    uVar11 = 0x147;
    pcVar12 = "st.type == xml_lite::Tag::START";
  }
  else {
    uVar11 = 0x146;
    pcVar12 = "st.elem_name == \"DataArray\"";
  }
  fail("assertion %s failed at %s +%d\n",pcVar12,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_vtk.cpp"
       ,uVar11);
}

Assistant:

void read_vtu_ents(std::istream& stream, Mesh* mesh) {
  bool needs_swapping, is_compressed;
  read_vtkfile_vtu_start_tag(stream, &needs_swapping, &is_compressed);
  auto tag1 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag1.elem_name == "UnstructuredGrid");
  LO nverts, ncells;
  read_piece_start_tag(stream, &nverts, &ncells);
  auto tag2 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag2.elem_name == "Cells");
  auto comm = mesh->comm();
  Omega_h_Family family;
  Int dim;
  LOs ev2v;
  read_connectivity(stream, comm, ncells, needs_swapping, is_compressed,
      &family, &dim, &ev2v);
  mesh->set_family(family);
  mesh->set_dim(dim);
  auto tag3 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag3.elem_name == "Cells");
  auto tag4 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag4.elem_name == "Points");
  auto coords = read_known_array<Real>(
      stream, "coordinates", nverts, 3, needs_swapping, is_compressed);
  if (dim < 3) coords = resize_vectors(coords, 3, dim);
  auto tag5 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag5.elem_name == "Points");
  auto tag6 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag6.elem_name == "PointData");
  GOs vert_globals;
  if (mesh->could_be_shared(VERT)) {
    vert_globals = read_known_array<GO>(
        stream, "global", nverts, 1, needs_swapping, is_compressed);
  } else {
    vert_globals = Read<GO>(nverts, 0, 1);
  }
  build_verts_from_globals(mesh, vert_globals);
  mesh->add_tag(VERT, "coordinates", dim, coords, true);
  while (read_tag(stream, mesh, VERT, needs_swapping, is_compressed))
    ;
  mesh->remove_tag(VERT, "local");
  mesh->remove_tag(VERT, "owner");
  auto tag7 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag7.elem_name == "CellData");
  GOs elem_globals;
  if (mesh->could_be_shared(dim)) {
    elem_globals = read_known_array<GO>(
        stream, "global", ncells, 1, needs_swapping, is_compressed);
  } else {
    elem_globals = Read<GO>(ncells, 0, 1);
  }
  build_ents_from_elems2verts(mesh, ev2v, vert_globals, elem_globals);
  while (read_tag(stream, mesh, dim, needs_swapping, is_compressed))
    ;
  mesh->remove_tag(dim, "local");
  mesh->remove_tag(dim, "owner");
  auto tag8 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag8.elem_name == "Piece");
  auto tag9 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag9.elem_name == "UnstructuredGrid");
  auto tag10 = xml_lite::read_tag(stream);
  OMEGA_H_CHECK(tag10.elem_name == "VTKFile");
}